

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_filter_xz.c
# Opt level: O0

int lzip_tail(archive_read_filter *self)

{
  uint32_t uVar1;
  long lVar2;
  uint32_t uVar3;
  int iVar4;
  uint64_t uVar5;
  uint64_t uVar6;
  int local_34;
  long lStack_30;
  int tail;
  ssize_t avail_in;
  uchar *f;
  private_data_conflict2 *state;
  archive_read_filter *self_local;
  
  f = (uchar *)self->data;
  if (f[0xa2] == '\0') {
    local_34 = 0xc;
  }
  else {
    local_34 = 0x14;
  }
  state = (private_data_conflict2 *)self;
  avail_in = (ssize_t)__archive_read_filter_ahead
                                (self->upstream,(long)local_34,&stack0xffffffffffffffd0);
  if (((void *)avail_in == (void *)0x0) && (lStack_30 < 0)) {
    self_local._4_4_ = -0x1e;
  }
  else if (lStack_30 < local_34) {
    archive_set_error((archive *)(state->stream).next_out,-1,"Lzip: Remaining data is less bytes");
    self_local._4_4_ = -0x19;
  }
  else {
    uVar1 = *(uint32_t *)(f + 0xa4);
    uVar3 = archive_le32dec((void *)avail_in);
    if (uVar1 == uVar3) {
      uVar6 = *(uint64_t *)(f + 0xb0);
      uVar5 = archive_le64dec((void *)(avail_in + 4));
      if (uVar6 == uVar5) {
        if ((f[0xa2] == '\x01') &&
           (lVar2 = *(long *)(f + 0xa8), uVar6 = archive_le64dec((void *)(avail_in + 0xc)),
           lVar2 + local_34 != uVar6)) {
          archive_set_error((archive *)(state->stream).next_out,-1,"Lzip: Member size error");
          return -0x19;
        }
        __archive_read_filter_consume
                  ((archive_read_filter *)(state->stream).total_in,(long)local_34);
        iVar4 = lzip_has_member((archive_read_filter *)(state->stream).total_in);
        if (iVar4 != 0) {
          f[0xa1] = '\0';
          f[0xa4] = '\0';
          f[0xa5] = '\0';
          f[0xa6] = '\0';
          f[0xa7] = '\0';
          f[0xb0] = '\0';
          f[0xb1] = '\0';
          f[0xb2] = '\0';
          f[0xb3] = '\0';
          f[0xb4] = '\0';
          f[0xb5] = '\0';
          f[0xb6] = '\0';
          f[0xb7] = '\0';
          f[0xa8] = '\0';
          f[0xa9] = '\0';
          f[0xaa] = '\0';
          f[0xab] = '\0';
          f[0xac] = '\0';
          f[0xad] = '\0';
          f[0xae] = '\0';
          f[0xaf] = '\0';
          f[0xa0] = '\0';
        }
        self_local._4_4_ = 0;
      }
      else {
        archive_set_error((archive *)(state->stream).next_out,-1,"Lzip: Uncompressed size error");
        self_local._4_4_ = -0x19;
      }
    }
    else {
      archive_set_error((archive *)(state->stream).next_out,-1,"Lzip: CRC32 error");
      self_local._4_4_ = -0x19;
    }
  }
  return self_local._4_4_;
}

Assistant:

static int
lzip_tail(struct archive_read_filter *self)
{
	struct private_data *state;
	const unsigned char *f;
	ssize_t avail_in;
	int tail;

	state = (struct private_data *)self->data;
	if (state->lzip_ver == 0)
		tail = 12;
	else
		tail = 20;
	f = __archive_read_filter_ahead(self->upstream, tail, &avail_in);
	if (f == NULL && avail_in < 0)
		return (ARCHIVE_FATAL);
	if (avail_in < tail) {
		archive_set_error(&self->archive->archive, ARCHIVE_ERRNO_MISC,
		    "Lzip: Remaining data is less bytes");
		return (ARCHIVE_FAILED);
	}

	/* Check the crc32 value of the uncompressed data of the current
	 * member */
	if (state->crc32 != archive_le32dec(f)) {
		archive_set_error(&self->archive->archive, ARCHIVE_ERRNO_MISC,
		    "Lzip: CRC32 error");
		return (ARCHIVE_FAILED);
	}

	/* Check the uncompressed size of the current member */
	if ((uint64_t)state->member_out != archive_le64dec(f + 4)) {
		archive_set_error(&self->archive->archive, ARCHIVE_ERRNO_MISC,
		    "Lzip: Uncompressed size error");
		return (ARCHIVE_FAILED);
	}

	/* Check the total size of the current member */
	if (state->lzip_ver == 1 &&
	    (uint64_t)state->member_in + tail != archive_le64dec(f + 12)) {
		archive_set_error(&self->archive->archive, ARCHIVE_ERRNO_MISC,
		    "Lzip: Member size error");
		return (ARCHIVE_FAILED);
	}
	__archive_read_filter_consume(self->upstream, tail);

	/* If current lzip data consists of multi member, try decompressing
	 * a next member. */
	if (lzip_has_member(self->upstream) != 0) {
		state->in_stream = 0;
		state->crc32 = 0;
		state->member_out = 0;
		state->member_in = 0;
		state->eof = 0;
	}
	return (ARCHIVE_OK);
}